

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O1

void __thiscall
duckdb::RadixPartitionedTupleData::ComputePartitionIndices
          (RadixPartitionedTupleData *this,Vector *row_locations,idx_t count,
          Vector *partition_indices,
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *utility_vector)

{
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr_00;
  column_t column_id;
  idx_t iVar1;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var2;
  Vector *this_00;
  type result;
  pointer this_01;
  SelectionVector *pSVar3;
  SelectionVector *target_sel;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_68;
  idx_t count_local;
  Vector *local_58;
  Vector *local_50;
  LogicalType local_48;
  
  count_local = count;
  if ((utility_vector->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    this_00 = (Vector *)operator_new(0x68);
    LogicalType::LogicalType(&local_48,UBIGINT);
    Vector::Vector(this_00,&local_48,0x800);
    local_68._M_head_impl = this_00;
    LogicalType::~LogicalType(&local_48);
    _Var2._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (Vector *)0x0;
    __ptr_00._M_head_impl =
         (utility_vector->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    (utility_vector->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (__ptr_00._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)utility_vector,__ptr_00._M_head_impl);
    }
    if (local_68._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_68,local_68._M_head_impl);
    }
  }
  local_58 = row_locations;
  local_50 = partition_indices;
  result = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (utility_vector);
  this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->((this->super_PartitionedTupleData).partitions.
                         super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  pSVar3 = FlatVector::IncrementalSelectionVector();
  iVar1 = count_local;
  column_id = this->hash_col_idx;
  target_sel = FlatVector::IncrementalSelectionVector();
  TupleDataCollection::Gather
            (this_01,local_58,pSVar3,iVar1,column_id,result,target_sel,
             (optional_ptr<duckdb::Vector,_true>)0x0);
  iVar1 = this->radix_bits;
  pSVar3 = FlatVector::IncrementalSelectionVector();
  RadixBitsSwitch<duckdb::ComputePartitionIndicesFunctor,void,duckdb::Vector&,duckdb::Vector&,unsigned_long&,duckdb::SelectionVector_const&,unsigned_long&>
            (iVar1,result,local_50,&count_local,pSVar3,&count_local);
  return;
}

Assistant:

void RadixPartitionedTupleData::ComputePartitionIndices(Vector &row_locations, idx_t count, Vector &partition_indices,
                                                        unique_ptr<Vector> &utility_vector) const {
	if (!utility_vector) {
		utility_vector = make_uniq<Vector>(LogicalType::HASH);
	}
	Vector &intermediate = *utility_vector;
	partitions[0]->Gather(row_locations, *FlatVector::IncrementalSelectionVector(), count, hash_col_idx, intermediate,
	                      *FlatVector::IncrementalSelectionVector(), nullptr);
	RadixBitsSwitch<ComputePartitionIndicesFunctor, void>(radix_bits, intermediate, partition_indices, count,
	                                                      *FlatVector::IncrementalSelectionVector(), count);
}